

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderCreateShaderProgramvTest::iterate(GeometryShaderCreateShaderProgramvTest *this)

{
  GLuint *pGVar1;
  ostringstream *this_00;
  GeometryShaderCreateShaderProgramvTest *this_01;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  MessageBuilder *this_02;
  NotSupportedError *this_03;
  char *description;
  uint *value;
  uchar *puVar5;
  long lVar6;
  TestContext **ppTVar7;
  qpTestResult testResult;
  long lVar8;
  bool bVar9;
  GLint link_status;
  GeometryShaderCreateShaderProgramvTest *local_288;
  char *vs_specialized_code_raw;
  char *gs_specialized_code_raw;
  char *fs_specialized_code_raw;
  string vs_specialized_code;
  string gs_specialized_code;
  string fs_specialized_code;
  uint local_208;
  GLuint so_po_ids [3];
  uchar result_data [64];
  undefined1 local_1b0 [384];
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar2);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_03,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0x109);
    __cxa_throw(this_03,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initFBO(this);
  TestCaseBase::specializeShader_abi_cxx11_
            (&fs_specialized_code,&this->super_TestCaseBase,1,&fs_code);
  fs_specialized_code_raw = fs_specialized_code._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&gs_specialized_code,&this->super_TestCaseBase,1,&gs_code);
  gs_specialized_code_raw = gs_specialized_code._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&vs_specialized_code,&this->super_TestCaseBase,1,&vs_code);
  vs_specialized_code_raw = vs_specialized_code._M_dataplus._M_p;
  link_status = 1;
  GVar3 = (**(code **)(lVar8 + 0x3f8))(0x8dd9,1,&gs_code);
  this->m_gs_po_id = GVar3;
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glCreateShaderProgramv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x120);
  if (this->m_gs_po_id == 0) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"glCreateShaderProgramv() call returned 0.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    (**(code **)(lVar8 + 0x9d8))(this->m_gs_po_id,0x8b82,&link_status);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"glGetProgramiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,300);
    if (link_status == 0) {
      (**(code **)(lVar8 + 0x448))(this->m_gs_po_id);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"glDeleteProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x138);
      GVar3 = (**(code **)(lVar8 + 0x3f8))(0x8b30,1,&fs_specialized_code_raw);
      this->m_fs_po_id = GVar3;
      GVar3 = (**(code **)(lVar8 + 0x3f8))(0x8dd9,1,&gs_specialized_code_raw);
      this->m_gs_po_id = GVar3;
      GVar3 = (**(code **)(lVar8 + 0x3f8))(0x8b31,1,&vs_specialized_code_raw);
      this->m_vs_po_id = GVar3;
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"glCreateShaderProgramv() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x142);
      if (this->m_vs_po_id != 0 && (this->m_gs_po_id != 0 && this->m_fs_po_id != 0)) {
        value = &local_208;
        so_po_ids[0] = this->m_fs_po_id;
        so_po_ids[1] = this->m_gs_po_id;
        so_po_ids[2] = this->m_vs_po_id;
        lVar6 = 3;
        local_288 = this;
LAB_00ccda37:
        this_01 = local_288;
        bVar9 = lVar6 != 0;
        lVar6 = lVar6 + -1;
        if (bVar9) goto code_r0x00ccda41;
        pGVar1 = &local_288->m_vao_id;
        (**(code **)(lVar8 + 0x708))(1,pGVar1);
        dVar4 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar4,"glGenVertexArrays() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x163);
        (**(code **)(lVar8 + 0xd8))(*pGVar1);
        dVar4 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar4,"glBindVertexArray() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x166);
        initPipelineObject(this_01);
        (**(code **)(lVar8 + 0x98))(this_01->m_pipeline_object_id);
        dVar4 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar4,"glBindProgramPipeline() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x16d);
        (**(code **)(lVar8 + 0x538))(0,0,1);
        dVar4 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar4,"glDrawArrays() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x171);
        (**(code **)(lVar8 + 0x1220))(0,0,4,4,0x1908,0x1401,result_data);
        dVar4 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar4,"glReadPixels() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x179);
        ppTVar7 = &(this_01->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
        this_00 = (ostringstream *)(local_1b0 + 8);
        bVar9 = true;
        puVar5 = result_data + 3;
        for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
          for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
            if ((((puVar5[lVar6 * 4 + -3] != '\0') || (puVar5[lVar6 * 4 + -2] != 0xff)) ||
                (puVar5[lVar6 * 4 + -1] != '\0')) || (puVar5[lVar6 * 4] != '\0')) {
              local_1b0._0_8_ = (*ppTVar7)->m_log;
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::operator<<((ostream *)this_00,"Invalid result texel found at (");
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::operator<<((ostream *)this_00,", ");
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::operator<<((ostream *)this_00,").");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this_00);
              bVar9 = false;
            }
          }
          puVar5 = puVar5 + 4;
        }
        this = local_288;
        if (bVar9) {
          description = "Pass";
          testResult = QP_TEST_RESULT_PASS;
          goto LAB_00ccdaf3;
        }
        goto LAB_00ccdae5;
      }
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),
                      "At least one glCreateShaderProgramv() call returned 0.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),
                      "An invalid shader program was linked successfully.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
LAB_00ccdadd:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
LAB_00ccdae5:
  testResult = QP_TEST_RESULT_FAIL;
  ppTVar7 = &(this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  description = "Fail";
LAB_00ccdaf3:
  tcu::TestContext::setTestResult(*ppTVar7,testResult,description);
  std::__cxx11::string::~string((string *)&vs_specialized_code);
  std::__cxx11::string::~string((string *)&gs_specialized_code);
  std::__cxx11::string::~string((string *)&fs_specialized_code);
  return STOP;
code_r0x00ccda41:
  (**(code **)(lVar8 + 0x9d8))(value[1],0x8b82,&link_status);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glGetProgramiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x155);
  this = local_288;
  value = value + 1;
  if (link_status != 1) goto code_r0x00ccda77;
  goto LAB_00ccda37;
code_r0x00ccda77:
  local_1b0._0_8_ = ((local_288->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  std::operator<<((ostream *)(local_1b0 + 8),"A valid shader program with id [");
  this_02 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
  std::operator<<(&(this_02->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  "] was not linked successfully.");
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  goto LAB_00ccdadd;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderCreateShaderProgramvTest::iterate()
{
	const glw::Functions& gl		  = m_context.getRenderContext().getFunctions();
	const unsigned int	n_so_po_ids = 3;
	bool				  result	  = true;
	glw::GLuint			  so_po_ids[n_so_po_ids];

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Initialize off-screen rendering */
	initFBO();

	/* Form shader sources */
	std::string fs_specialized_code = specializeShader(1,
													   /* parts */ &fs_code);
	const char* fs_specialized_code_raw = fs_specialized_code.c_str();
	std::string gs_specialized_code		= specializeShader(1,
													   /* parts */ &gs_code);
	const char* gs_specialized_code_raw = gs_specialized_code.c_str();
	std::string vs_specialized_code		= specializeShader(1,
													   /* parts */ &vs_code);
	const char* vs_specialized_code_raw = vs_specialized_code.c_str();

	/* Try to create an invalid geometry shader program first */
	glw::GLint link_status = GL_TRUE;

	m_gs_po_id = gl.createShaderProgramv(GL_GEOMETRY_SHADER, 1, /* count */
										 &gs_code);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call failed.");

	if (m_gs_po_id == 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glCreateShaderProgramv() call returned 0."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	gl.getProgramiv(m_gs_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_FALSE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "An invalid shader program was linked successfully."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	gl.deleteProgram(m_gs_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram() call failed.");

	/* Create shader programs */
	m_fs_po_id = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, /* count */
										 &fs_specialized_code_raw);
	m_gs_po_id = gl.createShaderProgramv(GL_GEOMETRY_SHADER, 1, /* count */
										 &gs_specialized_code_raw);
	m_vs_po_id = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, /* count */
										 &vs_specialized_code_raw);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call(s) failed.");

	if (m_fs_po_id == 0 || m_gs_po_id == 0 || m_vs_po_id == 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "At least one glCreateShaderProgramv() call returned 0."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Make sure all shader programs were linked successfully */
	so_po_ids[0] = m_fs_po_id;
	so_po_ids[1] = m_gs_po_id;
	so_po_ids[2] = m_vs_po_id;

	for (unsigned int n_po_id = 0; n_po_id != n_so_po_ids; ++n_po_id)
	{
		gl.getProgramiv(so_po_ids[n_po_id], GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

		if (link_status != GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "A valid shader program with id [" << so_po_ids[n_po_id]
							   << "] was not linked successfully." << tcu::TestLog::EndMessage;

			result = false;
			goto end;
		}
	}

	/* Set up the vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Set up the pipeline object */
	initPipelineObject();

	/* Render a full-screen quad */
	gl.bindProgramPipeline(m_pipeline_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");

	gl.drawArrays(GL_POINTS, 0, /* first */
				  1);			/* count */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");

	/* Verify the rendering result */
	unsigned char result_data[m_to_width * m_to_height * 4 /* rgba */];

	gl.readPixels(0, /* x */
				  0, /* y */
				  m_to_width, m_to_height, GL_RGBA, GL_UNSIGNED_BYTE, result_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

	for (unsigned int y = 0; y < m_to_height; ++y)
	{
		unsigned char* traveller_ptr = result_data + 4 * y;

		for (unsigned int x = 0; x < m_to_width; ++x)
		{
			if (traveller_ptr[0] != 0 || traveller_ptr[1] != 255 || traveller_ptr[2] != 0 || traveller_ptr[3] != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid result texel found at (" << x << ", " << y
								   << ")." << tcu::TestLog::EndMessage;

				result = false;
			}

			traveller_ptr += 4; /* rgba */
		}
	}

end:
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}